

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_ea.h
# Opt level: O0

void print_ea(size_t idx,size_t offset,FILE_FULL_EA_INFORMATION *e)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  CHAR *pCVar4;
  size_t sVar5;
  void *pvVar6;
  undefined8 uVar7;
  CHAR *__beg;
  char *data_end;
  char *data_first;
  bool local_42;
  allocator<char> local_41;
  string local_40 [32];
  FILE_FULL_EA_INFORMATION *local_20;
  FILE_FULL_EA_INFORMATION *e_local;
  size_t offset_local;
  size_t idx_local;
  
  local_20 = e;
  e_local = (FILE_FULL_EA_INFORMATION *)offset;
  offset_local = idx;
  pvVar6 = iffl::cast_to_void_ptr<_FILE_FULL_EA_INFORMATION_const>(e);
  printf("FILE_FULL_EA_INFORMATION[%zi] @ = 0x%p, buffer offset %zi\n",idx,pvVar6,e_local);
  printf("FILE_FULL_EA_INFORMATION[%zi].NextEntryOffset = %u\n",offset_local,
         (ulong)local_20->NextEntryOffset);
  printf("FILE_FULL_EA_INFORMATION[%zi].Flags = %i\n",offset_local,(ulong)local_20->Flags);
  sVar5 = offset_local;
  bVar1 = local_20->EaNameLength;
  local_42 = local_20->EaNameLength == '\0';
  if (local_42) {
    std::__cxx11::string::string(local_40);
  }
  else {
    __beg = local_20->EaName;
    bVar2 = local_20->EaNameLength;
    pCVar4 = local_20->EaName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_40,__beg,pCVar4 + bVar2,&local_41);
  }
  local_42 = !local_42;
  uVar7 = std::__cxx11::string::c_str();
  printf("FILE_FULL_EA_INFORMATION[%zi].EaNameLength = %i \"%s\"\n",sVar5,(ulong)bVar1,uVar7);
  std::__cxx11::string::~string(local_40);
  if (local_42) {
    std::allocator<char>::~allocator(&local_41);
  }
  printf("FILE_FULL_EA_INFORMATION[%zi].EaValueLength = %hu\n",offset_local,
         (ulong)local_20->EaValueLength);
  if (local_20->EaValueLength != 0) {
    bVar1 = local_20->EaNameLength;
    uVar3 = local_20->EaValueLength;
    pCVar4 = local_20->EaName;
    for (data_end = local_20->EaName + (int)(uint)local_20->EaNameLength;
        data_end != pCVar4 + (long)(int)(uint)uVar3 + (long)(int)(uint)bVar1;
        data_end = data_end + 1) {
      printf("%x",(ulong)(uint)(int)*data_end);
    }
    printf("\n");
  }
  return;
}

Assistant:

inline void print_ea(size_t idx, 
                     size_t offset,
                     FILE_FULL_EA_INFORMATION const &e) {
    std::printf("FILE_FULL_EA_INFORMATION[%zi] @ = 0x%p, buffer offset %zi\n",
           idx,
           iffl::cast_to_void_ptr(&e),
           offset);
    std::printf("FILE_FULL_EA_INFORMATION[%zi].NextEntryOffset = %u\n",
           idx,
           e.NextEntryOffset);
    std::printf("FILE_FULL_EA_INFORMATION[%zi].Flags = %i\n",
           idx,
           static_cast<int>(e.Flags));
    std::printf("FILE_FULL_EA_INFORMATION[%zi].EaNameLength = %i \"%s\"\n",
           idx,
           static_cast<int>(e.EaNameLength),
           (e.EaNameLength ? std::string{ e.EaName, e.EaName + e.EaNameLength }
                           : std::string{}).c_str());
    std::printf("FILE_FULL_EA_INFORMATION[%zi].EaValueLength = %hu\n",
           idx,
           e.EaValueLength);
    if (e.EaValueLength) {
        char const * data_first = e.EaName + e.EaNameLength;
        char const * const data_end = e.EaName + e.EaNameLength + e.EaValueLength;
        for (; data_first != data_end; ++data_first) {
            std::printf("%x", static_cast<int>(*data_first));
        }
        std::printf("\n");
    }
}